

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

void __thiscall
QFragmentMapData<QTextBlockData>::rebalance(QFragmentMapData<QTextBlockData> *this,uint x)

{
  uint *puVar1;
  uint x_00;
  uint uVar2;
  Header *pHVar3;
  ulong uVar4;
  ulong uVar5;
  uint x_01;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  *(undefined4 *)((long)(this->field_0).head + (ulong)x * 0x48 + 0xc) = 0;
  uVar5 = (ulong)x;
  do {
    while( true ) {
      pHVar3 = (this->field_0).head;
      x_00 = *(uint *)((long)pHVar3 + uVar5 * 0x48);
      uVar4 = (ulong)x_00;
      if ((uVar4 == 0) || (lVar9 = uVar4 * 0x48, *(int *)((long)pHVar3 + uVar4 * 0x48 + 0xc) != 0))
      {
        *(undefined4 *)((long)pHVar3 + (ulong)pHVar3->root * 0x48 + 0xc) = 1;
        return;
      }
      puVar1 = (uint *)((long)pHVar3 + lVar9);
      x_01 = *puVar1;
      uVar6 = (ulong)x_01;
      uVar2 = *(uint *)((long)pHVar3 + uVar6 * 0x48 + 4);
      if (x_00 != uVar2) break;
      uVar7 = (ulong)*(uint *)((long)pHVar3 + uVar6 * 0x48 + 8);
      if ((uVar7 == 0) || (lVar8 = uVar7 * 0x48, *(int *)((long)pHVar3 + uVar7 * 0x48 + 0xc) != 0))
      {
        if ((uint)uVar5 == puVar1[2]) {
          rotateLeft(this,x_00);
          pHVar3 = (this->field_0).head;
          uVar4 = (ulong)*(uint *)((long)pHVar3 + lVar9);
          x_01 = *(uint *)((long)pHVar3 + uVar4 * 0x48);
          uVar5 = (ulong)x_00;
        }
        *(undefined4 *)((long)pHVar3 + uVar4 * 0x48 + 0xc) = 1;
        if (x_01 != 0) {
          *(undefined4 *)((long)(this->field_0).head + (ulong)x_01 * 0x48 + 0xc) = 0;
          rotateRight(this,x_01);
        }
      }
      else {
LAB_004643e5:
        puVar1[3] = 1;
        *(undefined4 *)((long)&((this->field_0).head)->node_count + lVar8) = 1;
        *(undefined4 *)((long)(this->field_0).head + uVar6 * 0x48 + 0xc) = 0;
        uVar5 = uVar6;
      }
    }
    if (((ulong)uVar2 != 0) &&
       (lVar8 = (ulong)uVar2 * 0x48, *(int *)((long)pHVar3 + lVar8 + 0xc) == 0)) goto LAB_004643e5;
    if ((uint)uVar5 == puVar1[1]) {
      rotateRight(this,x_00);
      pHVar3 = (this->field_0).head;
      uVar4 = (ulong)*(uint *)((long)pHVar3 + lVar9);
      x_01 = *(uint *)((long)pHVar3 + uVar4 * 0x48);
      uVar5 = (ulong)x_00;
    }
    *(undefined4 *)((long)pHVar3 + uVar4 * 0x48 + 0xc) = 1;
    if (x_01 != 0) {
      *(undefined4 *)((long)(this->field_0).head + (ulong)x_01 * 0x48 + 0xc) = 0;
      rotateLeft(this,x_01);
    }
  } while( true );
}

Assistant:

void QFragmentMapData<Fragment>::rebalance(uint x)
{
    F(x).color = Red;

    while (F(x).parent && F(F(x).parent).color == Red) {
        uint p = F(x).parent;
        uint pp = F(p).parent;
        Q_ASSERT(pp);
        if (p == F(pp).left) {
            uint y = F(pp).right;
            if (y && F(y).color == Red) {
                F(p).color = Black;
                F(y).color = Black;
                F(pp).color = Red;
                x = pp;
            } else {
                if (x == F(p).right) {
                    x = p;
                    rotateLeft(x);
                    p = F(x).parent;
                    pp = F(p).parent;
                }
                F(p).color = Black;
                if (pp) {
                    F(pp).color = Red;
                    rotateRight(pp);
                }
            }
        } else {
            uint y = F(pp).left;
            if (y && F(y).color == Red) {
                F(p).color = Black;
                F(y).color = Black;
                F(pp).color = Red;
                x = pp;
            } else {
                if (x == F(p).left) {
                    x = p;
                    rotateRight(x);
                    p = F(x).parent;
                    pp = F(p).parent;
                }
                F(p).color = Black;
                if (pp) {
                    F(pp).color = Red;
                    rotateLeft(pp);
                }
            }
        }
    }
    F(root()).color = Black;
}